

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dotdot.c
# Opt level: O1

char * Curl_dedotdotify(char *input)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *__s;
  char *pcVar5;
  char *__dest;
  char *pcVar6;
  char *__s2;
  
  sVar3 = strlen(input);
  pcVar4 = (char *)(*Curl_cmalloc)(sVar3 + 1);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    __s = (*Curl_cstrdup)(input);
    if (__s == (char *)0x0) {
      __s = pcVar4;
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar5 = strchr(__s,0x3f);
      __dest = pcVar4;
      __s2 = __s;
      if (pcVar5 != (char *)0x0) {
        *pcVar5 = '\0';
      }
      do {
        iVar2 = strncmp("./",__s2,2);
        if (iVar2 == 0) {
LAB_004e2bb3:
          __s2 = __s2 + 2;
        }
        else {
          iVar2 = strncmp("../",__s2,3);
          if (iVar2 == 0) {
            __s2 = __s2 + 3;
          }
          else {
            iVar2 = strncmp("/./",__s2,3);
            if (iVar2 == 0) goto LAB_004e2bb3;
            iVar2 = strcmp("/.",__s2);
            if (iVar2 == 0) {
              __s2[1] = '/';
              __s2 = __s2 + 1;
            }
            else {
              iVar2 = strncmp("/../",__s2,4);
              if (iVar2 == 0) {
                __s2 = __s2 + 3;
                do {
                  if (__dest <= pcVar4) break;
                  pcVar6 = __dest + -1;
                  pcVar1 = __dest + -1;
                  __dest = pcVar6;
                } while (*pcVar1 != '/');
              }
              else {
                iVar2 = strcmp("/..",__s2);
                if (iVar2 != 0) {
                  iVar2 = strcmp(".",__s2);
                  if ((iVar2 == 0) || (iVar2 = strcmp("..",__s2), iVar2 == 0)) {
                    *__s2 = '\0';
                  }
                  else {
                    do {
                      *__dest = *__s2;
                      pcVar6 = __s2 + 1;
                      __s2 = __s2 + 1;
                      __dest = __dest + 1;
                      if (*pcVar6 == '/') break;
                    } while (*pcVar6 != '\0');
                    *__dest = '\0';
                  }
                  goto LAB_004e2c10;
                }
                __s2[2] = '/';
                __s2 = __s2 + 2;
                pcVar6 = __dest;
                do {
                  __dest = pcVar6;
                  if (pcVar6 <= pcVar4) break;
                  __dest = pcVar6 + -1;
                  pcVar1 = pcVar6 + -1;
                  pcVar6 = __dest;
                } while (*pcVar1 != '/');
              }
              *__dest = '\0';
            }
          }
        }
LAB_004e2c10:
      } while (*__s2 != '\0');
      if (pcVar5 != (char *)0x0) {
        sVar3 = strlen(input + ((long)pcVar5 - (long)__s));
        memcpy(__dest,input + ((long)pcVar5 - (long)__s),sVar3 + 1);
      }
    }
    (*Curl_cfree)(__s);
  }
  return pcVar4;
}

Assistant:

char *Curl_dedotdotify(const char *input)
{
  size_t inlen = strlen(input);
  char *clone;
  size_t clen = inlen; /* the length of the cloned input */
  char *out = malloc(inlen+1);
  char *outptr;
  char *orgclone;
  char *queryp;
  if(!out)
    return NULL; /* out of memory */

  /* get a cloned copy of the input */
  clone = strdup(input);
  if(!clone) {
    free(out);
    return NULL;
  }
  orgclone = clone;
  outptr = out;

  /*
   * To handle query-parts properly, we must find it and remove it during the
   * dotdot-operation and then append it again at the end to the output
   * string.
   */
  queryp = strchr(clone, '?');
  if(queryp)
    *queryp = 0;

  do {

    /*  A.  If the input buffer begins with a prefix of "../" or "./", then
        remove that prefix from the input buffer; otherwise, */

    if(!strncmp("./", clone, 2)) {
      clone+=2;
      clen-=2;
    }
    else if(!strncmp("../", clone, 3)) {
      clone+=3;
      clen-=3;
    }

    /*  B.  if the input buffer begins with a prefix of "/./" or "/.", where
        "."  is a complete path segment, then replace that prefix with "/" in
        the input buffer; otherwise, */
    else if(!strncmp("/./", clone, 3)) {
      clone+=2;
      clen-=2;
    }
    else if(!strcmp("/.", clone)) {
      clone[1]='/';
      clone++;
      clen-=1;
    }

    /*  C.  if the input buffer begins with a prefix of "/../" or "/..", where
        ".." is a complete path segment, then replace that prefix with "/" in
        the input buffer and remove the last segment and its preceding "/" (if
        any) from the output buffer; otherwise, */

    else if(!strncmp("/../", clone, 4)) {
      clone+=3;
      clen-=3;
      /* remove the last segment from the output buffer */
      while(outptr > out) {
        outptr--;
        if(*outptr == '/')
          break;
      }
      *outptr = 0; /* zero-terminate where it stops */
    }
    else if(!strcmp("/..", clone)) {
      clone[2]='/';
      clone+=2;
      clen-=2;
      /* remove the last segment from the output buffer */
      while(outptr > out) {
        outptr--;
        if(*outptr == '/')
          break;
      }
      *outptr = 0; /* zero-terminate where it stops */
    }

    /*  D.  if the input buffer consists only of "." or "..", then remove
        that from the input buffer; otherwise, */

    else if(!strcmp(".", clone) || !strcmp("..", clone)) {
      *clone=0;
    }

    else {
      /*  E.  move the first path segment in the input buffer to the end of
          the output buffer, including the initial "/" character (if any) and
          any subsequent characters up to, but not including, the next "/"
          character or the end of the input buffer. */

      do {
        *outptr++ = *clone++;
        clen--;
      } while(*clone && (*clone != '/'));
      *outptr = 0;
    }

  } while(*clone);

  if(queryp) {
    size_t qlen;
    /* There was a query part, append that to the output. The 'clone' string
       may now have been altered so we copy from the original input string
       from the correct index. */
    size_t oindex = queryp - orgclone;
    qlen = strlen(&input[oindex]);
    memcpy(outptr, &input[oindex], qlen+1); /* include the ending zero byte */
  }

  free(orgclone);
  return out;
}